

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascReadFile.cpp
# Opt level: O2

DWORD CascSetFilePointer(HANDLE hFile,LONG lFilePos,LONG *plFilePosHigh,DWORD dwMoveMethod)

{
  DWORD dwErrCode;
  TCascFile *pTVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lStack_20;
  
  pTVar1 = IsValidCascFileHandle(hFile);
  if (pTVar1 == (TCascFile *)0x0) {
    dwErrCode = 9;
  }
  else {
    if (dwMoveMethod == 0) {
      uVar4 = 0;
LAB_00115317:
      if (plFilePosHigh == (LONG *)0x0) {
        uVar2 = lFilePos >> 0x1f;
      }
      else {
        uVar2 = *plFilePosHigh;
      }
      uVar5 = (long)lFilePos | (ulong)uVar2 << 0x20;
      uVar3 = 0;
      if (!CARRY8(uVar5,uVar4)) {
        uVar3 = uVar5 + uVar4;
      }
      if (uVar3 >> 0x20 == 0) {
        pTVar1->FilePointer = (DWORD)uVar3;
        if (plFilePosHigh != (LONG *)0x0) {
          *plFilePosHigh = 0;
          uVar3 = (ulong)pTVar1->FilePointer;
        }
        goto LAB_0011535c;
      }
    }
    else {
      if (dwMoveMethod == 1) {
        lStack_20 = 0x48;
LAB_0011530e:
        uVar4 = (ulong)*(uint *)((long)&((TCascFile *)(&pTVar1->CKey + -2))->hs + lStack_20);
        goto LAB_00115317;
      }
      if (dwMoveMethod == 2) {
        lStack_20 = 0x50;
        goto LAB_0011530e;
      }
    }
    dwErrCode = 0x16;
  }
  SetLastError(dwErrCode);
  uVar3 = 0xffffffffffffffff;
LAB_0011535c:
  return (DWORD)uVar3;
}

Assistant:

DWORD WINAPI CascSetFilePointer(HANDLE hFile, LONG lFilePos, LONG * plFilePosHigh, DWORD dwMoveMethod)
{
    TCascFile * hf;
    ULONGLONG FilePosition;
    ULONGLONG MoveOffset;
    DWORD dwFilePosHi;

    // If the hFile is not a valid file handle, return an error.
    hf = IsValidCascFileHandle(hFile);
    if(hf == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return CASC_INVALID_POS;
    }

    // Get the relative point where to move from
    switch(dwMoveMethod)
    {
        case FILE_BEGIN:
            FilePosition = 0;
            break;

        case FILE_CURRENT:
            FilePosition = hf->FilePointer;
            break;

        case FILE_END:
            FilePosition = hf->ContentSize;
            break;

        default:
            SetLastError(ERROR_INVALID_PARAMETER);
            return CASC_INVALID_POS;
    }

    // Now get the move offset. Note that both values form
    // a signed 64-bit value (a file pointer can be moved backwards)
    if(plFilePosHigh != NULL)
        dwFilePosHi = *plFilePosHigh;
    else
        dwFilePosHi = (lFilePos & 0x80000000) ? 0xFFFFFFFF : 0;
    MoveOffset = MAKE_OFFSET64(dwFilePosHi, lFilePos);

    // Now calculate the new file pointer
    // Do not allow the file pointer to overflow
    FilePosition = ((FilePosition + MoveOffset) >= FilePosition) ? (FilePosition + MoveOffset) : 0;

    // CASC files can't be bigger than 4 GB.
    // We don't allow to go past 4 GB
    if(FilePosition >> 32)
    {
        SetLastError(ERROR_INVALID_PARAMETER);
        return CASC_INVALID_POS;
    }

    // Change the file position
    hf->FilePointer = (DWORD)FilePosition;

    // Return the new file position
    if(plFilePosHigh != NULL)
        *plFilePosHigh = 0;
    return hf->FilePointer;
}